

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O2

void text_out_to_screen(uint8_t a,char *str)

{
  bool bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  long lVar4;
  wchar_t wVar5;
  undefined7 in_register_00000039;
  wchar_t wVar6;
  ulong uVar7;
  wchar_t *dest;
  long lVar8;
  wchar_t local_1858;
  wchar_t y;
  wchar_t local_1850;
  wchar_t local_184c;
  uint local_1848;
  wchar_t local_1844;
  wchar_t h;
  wchar_t wid;
  wchar_t cv [256];
  wchar_t av [256];
  wchar_t buf [1024];
  
  uVar7 = CONCAT71(in_register_00000039,a) & 0xffffffff;
  Term_get_size(&wid,&h);
  Term_locate(&local_1858,&y);
  dest = buf;
  text_mbstowcs(dest,str,L'Ѐ');
  wVar3 = wid;
  if (text_out_wrap < wid) {
    wVar3 = text_out_wrap;
  }
  if (text_out_wrap < L'\x01') {
    wVar3 = wid;
  }
  wVar6 = wVar3 + L'\xffffffff';
  local_1850 = wVar3 + L'\xfffffffe';
  lVar4 = (long)wVar6;
  local_1848 = (uint)CONCAT71(in_register_00000039,a);
  local_184c = wVar6;
  do {
    wVar5 = L' ';
    wVar2 = *dest;
    if (wVar2 == L'\n') {
      local_1858 = text_out_indent;
      y = y + L'\x01';
      Term_erase(text_out_indent,y,L'ÿ');
      local_1858 = local_1858 + text_out_pad;
      Term_gotoxy(local_1858,y);
    }
    else {
      if (wVar2 == L'\0') {
        return;
      }
      wVar2 = text_iswprint(wVar2);
      if (wVar2 != L'\0') {
        wVar5 = *dest;
      }
      if (wVar5 != L' ' && wVar6 <= local_1858) {
        local_1844 = wVar5;
        if (local_1858 < wVar3) {
          wVar6 = L'\0';
          wVar2 = local_1850;
          do {
            wVar5 = wVar6;
            if (wVar2 < L'\0') break;
            uVar7 = (ulong)(uint)wVar2;
            Term_what(wVar2,y,av + (uint)wVar2,cv + uVar7);
            wVar6 = wVar2;
            wVar2 = wVar2 + L'\xffffffff';
          } while (cv[uVar7] != L' ');
          uVar7 = (ulong)local_1848;
          wVar6 = local_184c;
          if (wVar5 == L'\0') goto LAB_001d5d65;
        }
        else {
LAB_001d5d65:
          wVar5 = wVar3;
        }
        Term_erase(wVar5,y,L'ÿ');
        local_1858 = text_out_indent;
        y = y + L'\x01';
        Term_erase(text_out_indent,y,L'ÿ');
        local_1858 = local_1858 + text_out_pad;
        Term_gotoxy(local_1858,y);
        for (lVar8 = (long)wVar5; wVar5 = local_1844, lVar8 < lVar4; lVar8 = lVar8 + 1) {
          Term_addch(av[lVar8],cv[lVar8]);
          bVar1 = wVar3 <= local_1858;
          local_1858 = local_1858 + L'\x01';
          if (bVar1) {
            local_1858 = wVar3;
          }
        }
      }
      Term_addch((wchar_t)uVar7,wVar5);
      bVar1 = wVar3 <= local_1858;
      local_1858 = local_1858 + L'\x01';
      if (bVar1) {
        local_1858 = wVar3;
      }
    }
    dest = dest + 1;
  } while( true );
}

Assistant:

void text_out_to_screen(uint8_t a, const char *str)
{
	int x, y;

	int wid, h;

	int wrap;

	const wchar_t *s;
	wchar_t buf[1024];

	/* Obtain the size */
	(void)Term_get_size(&wid, &h);

	/* Obtain the cursor */
	(void)Term_locate(&x, &y);

	/* Copy to a rewriteable string */
	text_mbstowcs(buf, str, 1024);
	
	/* Use special wrapping boundary? */
	if ((text_out_wrap > 0) && (text_out_wrap < wid))
		wrap = text_out_wrap;
	else
		wrap = wid;

	/* Process the string */
	for (s = buf; *s; s++) {
		wchar_t ch;

		/* Force wrap */
		if (*s == L'\n') {
			/* Wrap */
			x = text_out_indent;
			y++;

			/* Clear line, move cursor */
			Term_erase(x, y, 255);

			x += text_out_pad;
			Term_gotoxy(x, y);

			continue;
		}

		/* Clean up the char */
		ch = (text_iswprint(*s) ? *s : L' ');

		/* Wrap words as needed */
		if ((x >= wrap - 1) && (ch != L' ')) {
			int i, n = 0;

			int av[256];
			wchar_t cv[256];

			/* Wrap word */
			if (x < wrap) {
				/* Scan existing text */
				for (i = wrap - 2; i >= 0; i--) {
					/* Grab existing attr/char */
					Term_what(i, y, &av[i], &cv[i]);

					/* Break on space */
					if (cv[i] == L' ') break;

					/* Track current word */
					n = i;
				}
			}

			/* Special case */
			if (n == 0) n = wrap;

			/* Clear line */
			Term_erase(n, y, 255);

			/* Wrap */
			x = text_out_indent;
			y++;

			/* Clear line, move cursor */
			Term_erase(x, y, 255);

			x += text_out_pad;
			Term_gotoxy(x, y);

			/* Wrap the word (if any) */
			for (i = n; i < wrap - 1; i++) {
				/* Dump */
				Term_addch(av[i], cv[i]);

				/* Advance (no wrap) */
				if (++x > wrap) x = wrap;
			}
		}

		/* Dump */
		Term_addch(a, ch);

		/* Advance */
		if (++x > wrap) x = wrap;
	}
}